

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

bool __thiscall Graph::is_all_visited(Graph *this)

{
  bool bVar1;
  long lVar2;
  bool *pbVar3;
  
  pbVar3 = &this->nodes[1].visited;
  lVar2 = 0;
  do {
    lVar2 = lVar2 + 1;
    if (this->num_node <= lVar2) break;
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 0x20;
  } while (bVar1 != false);
  return this->num_node <= lVar2;
}

Assistant:

bool Graph::is_all_visited() const
{
	for(int i = 1; i < num_node; i++){
		if(!nodes[i].visited){
			return false;
		}
	}
	return true;
}